

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_acct_resp(connectdata *conn,int ftpcode)

{
  CURLcode CVar1;
  ftpstate fVar2;
  
  if (ftpcode != 0xe6) {
    Curl_failf(conn->data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
    return CURLE_FTP_WEIRD_PASS_REPLY;
  }
  if (conn->ssl[0].use == true) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PBSZ %d",0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PBSZ;
  }
  else {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","PWD");
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PWD;
  }
  (conn->proto).ftpc.state = fVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_acct_resp(struct connectdata *conn,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  if(ftpcode != 230) {
    failf(data, "ACCT rejected by server: %03d", ftpcode);
    result = CURLE_FTP_WEIRD_PASS_REPLY; /* FIX */
  }
  else
    result = ftp_state_loggedin(conn);

  return result;
}